

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O0

void CVmBifNet::get_launch_host_addr(uint oargc)

{
  undefined4 in_EDI;
  TadsNetConfig *unaff_retaddr;
  char *host;
  undefined8 local_18;
  undefined4 in_stack_fffffffffffffff8;
  
  CVmBif::check_argc(0,0x251523);
  if (G_net_config_X == (TadsNetConfig *)0x0) {
    local_18 = (char *)0x0;
  }
  else {
    local_18 = TadsNetConfig::get(unaff_retaddr,(char *)CONCAT44(in_EDI,in_stack_fffffffffffffff8));
  }
  if (local_18 == (char *)0x0) {
    CVmBif::retval_nil();
  }
  else {
    CVmBif::retval_str(local_18);
  }
  return;
}

Assistant:

void CVmBifNet::get_launch_host_addr(VMG_ uint oargc)
{
    /* check arguments */
    check_argc(vmg_ oargc, 0);

    /* get the launch host name from the network configuration */
    const char *host = (G_net_config != 0
                        ? G_net_config->get("hostname")
                        : 0);

    /* if there's a host name, return it, otherwise return nil */
    if (host != 0)
        retval_str(vmg_ host);
    else
        retval_nil(vmg0_);
}